

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall Fossilize::ConcurrentDatabase::setup_bucket(ConcurrentDatabase *this)

{
  FILE *pFVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  type pDVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ConcurrentDatabase *local_18;
  ConcurrentDatabase *this_local;
  
  local_18 = this;
  std::__cxx11::string::operator+=((string *)&this->base_path,".");
  psVar6 = &this->bucket_dirname;
  std::__cxx11::string::operator+=((string *)&this->base_path,(string *)psVar6);
  uVar3 = Path::mkdir((char *)&this->base_path,(__mode_t)psVar6);
  pFVar1 = _stderr;
  if ((uVar3 & 1) == 0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Fossilize ERROR: Failed to create directory %s.\n",uVar4);
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::operator+=((string *)&this->base_path,"/");
    std::operator+(&local_38,&this->base_path,"TOUCH");
    bVar2 = Path::touch(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    pFVar1 = _stderr;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"Fossilize WARN: Failed to touch last access in %s.\n",uVar4);
    }
    std::operator+(&local_58,"/",&this->bucket_basename);
    std::__cxx11::string::operator+=((string *)&this->base_path,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
    if (bVar2) {
      std::operator+(&local_78,&this->base_path,".foz");
      pDVar5 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator*(&this->readonly_interface);
      std::__cxx11::string::operator=((string *)(pDVar5 + 2),(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool setup_bucket()
	{
		base_path += ".";
		base_path += bucket_dirname;

		if (!Path::mkdir(base_path))
		{
			LOGE("Failed to create directory %s.\n", base_path.c_str());
			return false;
		}

		base_path += "/";
		if (!Path::touch(base_path + "TOUCH"))
			LOGW("Failed to touch last access in %s.\n", base_path.c_str());
		base_path += "/" + bucket_basename;

		if (readonly_interface)
			static_cast<StreamArchive &>(*readonly_interface).path = base_path + ".foz";

		return true;
	}